

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::flipAlphaBlock5_half(uint8 *dst,uint8 *src)

{
  ulong uVar1;
  uint local_28;
  undefined2 uStack_24;
  uint64 flipbits;
  uint64 bits;
  uint8 *src_local;
  uint8 *dst_local;
  
  *dst = *src;
  dst[1] = src[1];
  uVar1 = *(ulong *)(src + 2);
  local_28 = (uint)((uVar1 & 0xfff) << 0xc) |
             (uint)(uVar1 >> 0xc) & 0xfff | (uint)(uVar1 & 0xffffff000000);
  *(uint *)(dst + 2) = local_28;
  uStack_24 = (undefined2)((uVar1 & 0xffffff000000) >> 0x20);
  *(undefined2 *)(dst + 6) = uStack_24;
  return;
}

Assistant:

static void
flipAlphaBlock5_half(uint8 *dst, uint8 *src)
{
	// color
	dst[0] = src[0];
	dst[1] = src[1];
	// bits
	uint64 bits = *(uint64*)&src[2];
	uint64 flipbits = bits & 0xFFFFFF000000;
	flipbits |= (bits>>12) & 0xFFF;
	flipbits |= (bits<<12) & 0xFFF000;
	memcpy(dst+2, &flipbits, 6);
}